

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O3

bool CheckProperty(TestResult *tr,char *key,char *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  bool bVar4;
  UnitTest *pUVar5;
  byte unaff_BPL;
  int *in_R9;
  pointer ppTVar6;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffc48;
  AssertionResult local_3b0;
  AssertionHelper local_388;
  char *local_358;
  char *local_350;
  undefined1 local_348 [392];
  byte local_1c0;
  undefined1 local_1b8 [392];
  
  if (tr != (TestResult *)0x0) {
    local_348._0_4_ = 1;
    local_1b8._0_4_ =
         (undefined4)
         ((ulong)((long)(tr->m_test_propertys).
                        super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(tr->m_test_propertys).
                       super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 6);
    local_358 = value;
    local_350 = key;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_3b0,(internal *)0x128a5e,"tr->test_property_count()",local_348,
               (int *)local_1b8,in_R9);
    bVar4 = local_3b0.m_result;
    if (local_3b0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
      local_1c0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,local_3b0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc4f);
      local_388.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
      ;
      local_388.m_part_result.super_iuCodeMessage.m_line = 0x29;
      local_388.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_388,(Fixed *)local_348,false);
      unaff_BPL = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_388.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_388.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
      std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    paVar1 = &local_3b0.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3b0.m_message._M_dataplus._M_p,
                      local_3b0.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar4 == false) goto LAB_00111215;
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_3b0,(internal *)0x127582,"tr->GetTestProperty(0).key()",local_350,
               (((tr->m_test_propertys).
                 super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_key)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc48);
    if (local_3b0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
      local_1c0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,local_3b0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc4f);
      local_388.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
      ;
      local_388.m_part_result.super_iuCodeMessage.m_line = 0x2a;
      local_388.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_388,(Fixed *)local_348,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_388.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_388.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
      std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3b0.m_message._M_dataplus._M_p,
                      local_3b0.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_3b0,(internal *)"value","tr->GetTestProperty(0).value()",local_358,
               (((tr->m_test_propertys).
                 super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_value)._M_dataplus._M_p,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc48);
    if (local_3b0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
      local_1c0 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,local_3b0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc4f);
      local_388.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
      ;
      local_388.m_part_result.super_iuCodeMessage.m_line = 0x2b;
      local_388.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_388,(Fixed *)local_348,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_388.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_388.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_388.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
      std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3b0.m_message._M_dataplus._M_p,
                      local_3b0.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar5 = iutest::UnitTest::instance();
  bVar4 = iutest::TestResult::Failed(&(pUVar5->super_UnitTestImpl).m_ad_hoc_testresult);
  if (bVar4) {
    unaff_BPL = 0;
  }
  else {
    ppTVar2 = (pUVar5->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar3 = (pUVar5->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar2 == ppTVar3) {
      unaff_BPL = 1;
    }
    else {
      do {
        ppTVar6 = ppTVar2 + 1;
        unaff_BPL = iutest::TestSuite::Passed(*ppTVar2);
        if (!(bool)unaff_BPL) break;
        ppTVar2 = ppTVar6;
      } while (ppTVar6 != ppTVar3);
    }
  }
LAB_00111215:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool CheckProperty(const ::iutest::TestResult* tr, const char* key, const char* value)
{
#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    try {
#endif

#if IUTEST_HAS_ASSERTION_RETURN
    if( tr != NULL )
    {
        IUTEST_ASSERT_EQ(1, tr->test_property_count()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(key, tr->GetTestProperty(0).key()) << ::iutest::AssertionReturn(false);
        IUTEST_EXPECT_STREQ(value, tr->GetTestProperty(0).value()) << ::iutest::AssertionReturn(false);
    }
#else
    CheckProperty_(tr, key, value);
#endif

#if IUTEST_USE_THROW_ON_ASSERTION_FAILURE
    } catch(...) {}
#endif
    return ::iutest::UnitTest::GetInstance()->Passed();
}